

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O2

Reals __thiscall Omega_h::measure_edges_metric(Omega_h *this,Mesh *mesh,LOs *a2e)

{
  void *extraout_RDX;
  Reals RVar1;
  allocator local_51;
  undefined1 local_50 [64];
  
  Write<int>::Write((Write<int> *)(local_50 + 0x10),&a2e->write_);
  std::__cxx11::string::string((string *)(local_50 + 0x20),"metric",&local_51);
  Mesh::get_array<double>((Mesh *)local_50,(Int)mesh,(string *)0x0);
  measure_edges_metric(this,mesh,(LOs *)(local_50 + 0x10),(Reals *)local_50);
  Write<double>::~Write((Write<double> *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  Write<int>::~Write((Write<int> *)(local_50 + 0x10));
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar1.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric(Mesh* mesh, LOs a2e) {
  return measure_edges_metric(mesh, a2e, mesh->get_array<Real>(VERT, "metric"));
}